

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Holding.cpp
# Opt level: O0

bool __thiscall
Holding::ChainHoldings
          (Holding *this,list<Card_*,_std::allocator<Card_*>_> *holdings,Holding *bought)

{
  bool bVar1;
  string *psVar2;
  reference ppCVar3;
  long lVar4;
  Holding *mine_3;
  _List_node_base *local_80;
  _List_node_base *local_78;
  reference local_70;
  Holding *mine_2;
  Holding *mine_1;
  _List_node_base *local_58;
  _List_node_base *local_50;
  reference local_48;
  Holding *mine;
  _List_node_base *local_38;
  _List_iterator<Card_*> local_30;
  iterator it;
  Holding *bought_local;
  list<Card_*,_std::allocator<Card_*>_> *holdings_local;
  Holding *this_local;
  
  it._M_node = (_List_node_base *)bought;
  psVar2 = BlackCard::getName_abi_cxx11_(&bought->super_BlackCard);
  bVar1 = std::operator!=(psVar2,"Mine");
  if (bVar1) {
    psVar2 = BlackCard::getName_abi_cxx11_((BlackCard *)it._M_node);
    bVar1 = std::operator!=(psVar2,"GoldMine");
    if (bVar1) {
      psVar2 = BlackCard::getName_abi_cxx11_((BlackCard *)it._M_node);
      bVar1 = std::operator!=(psVar2,"CrystalMine");
      if (bVar1) {
        return false;
      }
    }
  }
  std::_List_iterator<Card_*>::_List_iterator(&local_30);
  psVar2 = BlackCard::getName_abi_cxx11_((BlackCard *)it._M_node);
  bVar1 = std::operator==(psVar2,"Mine");
  if (bVar1) {
    local_38 = (_List_node_base *)
               std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::begin(holdings);
    local_30._M_node = local_38;
    while( true ) {
      mine = (Holding *)std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::end(holdings);
      bVar1 = std::operator!=(&local_30,(_Self *)&mine);
      if (!bVar1) break;
      ppCVar3 = std::_List_iterator<Card_*>::operator*(&local_30);
      psVar2 = Card::getName_abi_cxx11_(*ppCVar3);
      bVar1 = std::operator!=(psVar2,"GoldMine");
      if (!bVar1) {
        local_48 = std::_List_iterator<Card_*>::operator*(&local_30);
        lVar4 = (**(code **)&(*local_48)[1].field_0x10)();
        if (lVar4 == 0) {
          (**(code **)&(*local_48)[1].field_0x20)(local_48,it._M_node);
          (*(code *)(it._M_node)->_M_next[5]._M_next)(it._M_node,local_48);
          lVar4 = (**(code **)&(*local_48)[1].name)();
          if (lVar4 == 0) {
            *(int *)((long)local_48 + 0x94) = *(int *)((long)local_48 + 0x94) + 4;
            *(int *)((long)&it._M_node[9]._M_next + 4) =
                 *(int *)((long)&it._M_node[9]._M_next + 4) + 2;
          }
          else {
            *(int *)((long)local_48 + 0x94) = *(int *)((long)local_48 + 0x94) << 1;
            *(int *)&local_48[0x13][2].field_0x24 = *(int *)&local_48[0x13][2].field_0x24 * 3;
          }
          return true;
        }
      }
      local_50 = (_List_node_base *)std::_List_iterator<Card_*>::operator++(&local_30,0);
    }
  }
  else {
    psVar2 = BlackCard::getName_abi_cxx11_((BlackCard *)it._M_node);
    bVar1 = std::operator==(psVar2,"GoldMine");
    if (bVar1) {
      local_58 = (_List_node_base *)
                 std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::begin(holdings);
      local_30._M_node = local_58;
      while( true ) {
        mine_1 = (Holding *)std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::end(holdings);
        bVar1 = std::operator!=(&local_30,(_Self *)&mine_1);
        if (!bVar1) break;
        ppCVar3 = std::_List_iterator<Card_*>::operator*(&local_30);
        psVar2 = Card::getName_abi_cxx11_(*ppCVar3);
        bVar1 = std::operator==(psVar2,"Mine");
        if (bVar1) {
          mine_2 = (Holding *)std::_List_iterator<Card_*>::operator*(&local_30);
          lVar4 = (**(code **)&((Card *)(mine_2->super_BlackCard).super_Card._vptr_Card)[1].name)();
          if (lVar4 == 0) {
            (*(mine_2->super_BlackCard).super_Card._vptr_Card[10])(mine_2,it._M_node);
            (*(code *)(it._M_node)->_M_next[5]._M_prev)();
            *(int *)((long)&it._M_node[9]._M_next + 4) =
                 *(int *)((long)&it._M_node[9]._M_next + 4) + 4;
            mine_2->harvestValue = mine_2->harvestValue + 2;
          }
        }
        else {
          ppCVar3 = std::_List_iterator<Card_*>::operator*(&local_30);
          psVar2 = Card::getName_abi_cxx11_(*ppCVar3);
          bVar1 = std::operator==(psVar2,"CrystalMine");
          if (bVar1) {
            local_70 = std::_List_iterator<Card_*>::operator*(&local_30);
            lVar4 = (**(code **)&(*local_70)[1].field_0x10)();
            if (lVar4 == 0) {
              (**(code **)&(*local_70)[1].field_0x20)(local_70,it._M_node);
              (*(code *)(it._M_node)->_M_next[5]._M_next)();
              *(int *)((long)&it._M_node[9]._M_next + 4) =
                   *(int *)((long)&it._M_node[9]._M_next + 4) + 5;
              *(int *)((long)local_70 + 0x94) = this->harvestValue + *(int *)((long)local_70 + 0x94)
              ;
            }
          }
        }
        lVar4 = (*(code *)(it._M_node)->_M_next[4]._M_prev)();
        if ((lVar4 != 0) && (lVar4 = (*(code *)(it._M_node)->_M_next[4]._M_next)(), lVar4 != 0)) {
          return true;
        }
        local_78 = (_List_node_base *)std::_List_iterator<Card_*>::operator++(&local_30,0);
      }
      lVar4 = (*(code *)(it._M_node)->_M_next[4]._M_prev)();
      if ((lVar4 != 0) || (lVar4 = (*(code *)(it._M_node)->_M_next[4]._M_next)(), lVar4 != 0)) {
        return true;
      }
    }
    else {
      psVar2 = BlackCard::getName_abi_cxx11_((BlackCard *)it._M_node);
      bVar1 = std::operator==(psVar2,"CrystalMine");
      if (bVar1) {
        local_80 = (_List_node_base *)
                   std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::begin(holdings);
        local_30._M_node = local_80;
        while( true ) {
          mine_3 = (Holding *)std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::end(holdings);
          bVar1 = std::operator!=(&local_30,(_Self *)&mine_3);
          if (!bVar1) break;
          ppCVar3 = std::_List_iterator<Card_*>::operator*(&local_30);
          psVar2 = Card::getName_abi_cxx11_(*ppCVar3);
          bVar1 = std::operator!=(psVar2,"GoldMine");
          if (!bVar1) {
            ppCVar3 = std::_List_iterator<Card_*>::operator*(&local_30);
            lVar4 = (**(code **)&(*ppCVar3)[1].name)();
            if (lVar4 == 0) {
              (**(code **)&(*ppCVar3)[1].field_0x18)(ppCVar3,it._M_node);
              (*(code *)(it._M_node)->_M_next[5]._M_prev)(it._M_node,ppCVar3);
              lVar4 = (**(code **)&(*ppCVar3)[1].field_0x10)();
              if (lVar4 != 0) {
                *(int *)((long)ppCVar3 + 0x94) = *(int *)((long)ppCVar3 + 0x94) << 1;
                *(int *)&ppCVar3[0x13][2].field_0x24 = *(int *)&ppCVar3[0x13][2].field_0x24 * 3;
                return true;
              }
              *(int *)((long)&it._M_node[9]._M_next + 4) =
                   *(int *)((long)&it._M_node[9]._M_next + 4) + 5;
              *(int *)((long)ppCVar3 + 0x94) = *(int *)((long)ppCVar3 + 0x94) + 3;
              return true;
            }
          }
          std::_List_iterator<Card_*>::operator++(&local_30,0);
        }
      }
    }
  }
  return true;
}

Assistant:

bool Holding::ChainHoldings(list<Card*> holdings, Holding *bought)        //creates chains and adds bonuses if there are any possible connections
{
    if (bought->getName() != "Mine" && bought->getName() != "GoldMine" && bought->getName() != "CrystalMine")
        return false;

    list<Card*>::iterator it;

    if (bought->getName() == "Mine")
    {
        for (it=holdings.begin(); it!=holdings.end(); it++)
        {
            if ((*it)->getName() != "GoldMine")
                continue;

            Holding *mine = (Holding *)(&*it);

            if (!mine->getSubHolding())
            {
                mine->setSubHolding(bought);
                bought->setUpperHolding(mine);

                if (mine->getUpperHolding())
                {
                    mine->harvestValue *= 2;
                    mine->upperHolding->harvestValue *= 3;
                }
                else
                {
                    mine->harvestValue += 4;
                    bought->harvestValue += 2;
                }
                return true;
            }
        }
    }
    else if (bought->getName() == "GoldMine")
    {
        for (it=holdings.begin(); it!=holdings.end(); it++)
        {
            if ((*it)->getName() == "Mine")
            {
                Holding *mine = (Holding *)(&*it);

                if (!mine->getUpperHolding())
                {
                    mine->setUpperHolding(bought);
                    bought->setSubHolding(mine);

                    bought->harvestValue += 4;
                    mine->harvestValue += 2;
                }
            }
            else if ((*it)->getName() == "CrystalMine")
            {
                Holding *mine = (Holding *)(&*it);

                if (!mine->getSubHolding())
                {
                    mine->setSubHolding(bought);
                    bought->setUpperHolding(mine);

                    bought->harvestValue += 5;
                    mine->harvestValue += harvestValue;
                }
            }
            
            if (bought->getSubHolding() && bought->getUpperHolding())
                return true;
        }
        if (bought->getSubHolding() || bought->getUpperHolding())
            return true;
    }
    else if (bought->getName() == "CrystalMine")
    {
        for (it=holdings.begin(); it!=holdings.end(); it++)
        {
            if ((*it)->getName() != "GoldMine")
                continue;

            Holding *mine = (Holding *)(&*it);

            if (!mine->getUpperHolding())
            {
                mine->setUpperHolding(bought);
                bought->setSubHolding(mine);

                if (mine->getSubHolding())
                {
                    mine->harvestValue *= 2;
                    mine->upperHolding->harvestValue *= 3;
                }
                else
                {
                    bought->harvestValue += 5;
                    mine->harvestValue += 3;    //3 = initial mine harvest value
                }
                break;
            }
        }
    }
    return true;
}